

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

void AddHuffmanBits(uint symbol,uint length,uchar *bp,uchar **out,size_t *outsize)

{
  long *in_RCX;
  byte *in_RDX;
  uint in_ESI;
  uint in_EDI;
  ulong *in_R8;
  uint bit;
  uint i;
  undefined8 local_30;
  undefined4 local_24;
  
  for (local_24 = 0; local_24 < in_ESI; local_24 = local_24 + 1) {
    if (*in_RDX == 0) {
      if ((*in_R8 & *in_R8 - 1) == 0) {
        if (*in_R8 == 0) {
          local_30 = malloc(1);
        }
        else {
          local_30 = realloc((void *)*in_RCX,*in_R8 << 1);
        }
        *in_RCX = (long)local_30;
      }
      *(undefined1 *)(*in_RCX + *in_R8) = 0;
      *in_R8 = *in_R8 + 1;
    }
    *(byte *)(*in_RCX + (*in_R8 - 1)) =
         *(byte *)(*in_RCX + (*in_R8 - 1)) |
         (byte)((in_EDI >> (((char)in_ESI - (char)local_24) - 1U & 0x1f) & 1) << (*in_RDX & 0x1f));
    *in_RDX = *in_RDX + 1 & 7;
  }
  return;
}

Assistant:

static void AddHuffmanBits(unsigned symbol, unsigned length,
                           unsigned char* bp, unsigned char** out,
                           size_t* outsize) {
  /* TODO(lode): make more efficient (add more bits at once). */
  unsigned i;
  for (i = 0; i < length; i++) {
    unsigned bit = (symbol >> (length - i - 1)) & 1;
    if (*bp == 0) ZOPFLI_APPEND_DATA(0, out, outsize);
    (*out)[*outsize - 1] |= bit << *bp;
    *bp = (*bp + 1) & 7;
  }
}